

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void ldamath::vexpdigammify(vw *all,float *gamma,float underflow_threshold)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  undefined1 (*pauVar3) [16];
  float fVar4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  float *pfVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  
  uVar2 = (ulong)all->lda;
  pauVar1 = (undefined1 (*) [16])(gamma + uVar2);
  bVar8 = ((ulong)gamma & 0xf) != 0;
  fVar13 = 0.0;
  pauVar3 = (undefined1 (*) [16])gamma;
  pfVar7 = gamma;
  if (bVar8 && uVar2 != 0) {
    do {
      fVar16 = *(float *)*pauVar3;
      fVar18 = fVar16 + 2.0;
      fVar17 = (float)((uint)fVar18 & 0x7fffff | 0x3f000000);
      fVar13 = fVar13 + fVar16;
      auVar24._4_4_ = 0x3fdce9a3;
      auVar24._0_4_ = fVar16 * 6.0 + 13.0;
      auVar24._8_8_ = 0;
      auVar15._0_4_ = fVar18 * 12.0 * fVar18;
      auVar15._4_4_ = fVar17 + 0.35208872;
      auVar15._8_8_ = 0;
      auVar24 = divps(auVar24,auVar15);
      *(float *)*pauVar3 =
           ((fVar17 * -1.4980303 + (float)(uint)fVar18 * 1.1920929e-07 + -124.22545) - auVar24._4_4_
           ) * 0.6931472 + (-(fVar16 + fVar16 + 1.0) / ((fVar16 + 1.0) * fVar16) - auVar24._0_4_);
      pauVar3 = (undefined1 (*) [16])((long)*pauVar3 + 4);
      pfVar7 = pfVar7 + 1;
      if (pauVar1 <= pauVar3) break;
    } while (((ulong)pfVar7 & 0xf) != 0);
  }
  auVar15 = _DAT_0027c510;
  fVar16 = 0.0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  fVar19 = 0.0;
  pauVar6 = pauVar3;
  auVar24 = _DAT_0027c490;
  if (pauVar3 + 1 < pauVar1 && ((ulong)pfVar7 & 0xf) == 0) {
    do {
      fVar35 = *(float *)*pauVar3;
      fVar4 = *(float *)((long)*pauVar3 + 4);
      fVar9 = *(float *)((long)*pauVar3 + 8);
      fVar36 = *(float *)((long)*pauVar3 + 0xc);
      fVar16 = fVar16 + fVar35;
      fVar17 = fVar17 + fVar4;
      fVar18 = fVar18 + fVar9;
      fVar19 = fVar19 + fVar36;
      fVar26 = fVar35 + 2.0;
      fVar28 = fVar4 + 2.0;
      fVar30 = fVar9 + 2.0;
      fVar32 = fVar36 + 2.0;
      fVar27 = (float)((uint)fVar26 & 0x7fffff | 0x3f000000);
      fVar29 = (float)((uint)fVar28 & 0x7fffff | 0x3f000000);
      fVar31 = (float)((uint)fVar30 & 0x7fffff | 0x3f000000);
      fVar33 = (float)((uint)fVar32 & 0x7fffff | 0x3f000000);
      auVar25._0_4_ = fVar27 + 0.35208872;
      auVar25._4_4_ = fVar29 + 0.35208872;
      auVar25._8_4_ = fVar31 + 0.35208872;
      auVar25._12_4_ = fVar33 + 0.35208872;
      auVar25 = divps(auVar15,auVar25);
      auVar23._0_4_ = ((fVar35 * -30.0 + -127.0) * fVar35 + -157.0) * fVar35 + -48.0;
      auVar23._4_4_ = ((fVar4 * -30.0 + -127.0) * fVar4 + -157.0) * fVar4 + -48.0;
      auVar23._8_4_ = ((fVar9 * -30.0 + -127.0) * fVar9 + -157.0) * fVar9 + -48.0;
      auVar23._12_4_ = ((fVar36 * -30.0 + -127.0) * fVar36 + -157.0) * fVar36 + -48.0;
      auVar21._4_4_ = (fVar4 + 1.0) * fVar4 * 12.0 * fVar28 * fVar28;
      auVar21._0_4_ = (fVar35 + 1.0) * fVar35 * 12.0 * fVar26 * fVar26;
      auVar21._8_4_ = (fVar9 + 1.0) * fVar9 * 12.0 * fVar30 * fVar30;
      auVar21._12_4_ = (fVar36 + 1.0) * fVar36 * 12.0 * fVar32 * fVar32;
      auVar24 = divps(auVar23,auVar21);
      *(float *)*pauVar3 =
           auVar24._0_4_ +
           (auVar25._0_4_ + fVar27 * -1.4980303 + (float)(int)fVar26 * 1.1920929e-07 + -124.22552) *
           0.6931472;
      *(float *)((long)*pauVar3 + 4) =
           auVar24._4_4_ +
           (auVar25._4_4_ + fVar29 * -1.4980303 + (float)(int)fVar28 * 1.1920929e-07 + -124.22552) *
           0.6931472;
      *(float *)((long)*pauVar3 + 8) =
           auVar24._8_4_ +
           (auVar25._8_4_ + fVar31 * -1.4980303 + (float)(int)fVar30 * 1.1920929e-07 + -124.22552) *
           0.6931472;
      *(float *)((long)*pauVar3 + 0xc) =
           auVar24._12_4_ +
           (auVar25._12_4_ + fVar33 * -1.4980303 + (float)(int)fVar32 * 1.1920929e-07 + -124.22552)
           * 0.6931472;
      pauVar6 = pauVar3 + 1;
      pauVar5 = pauVar3 + 2;
      pauVar3 = pauVar6;
      auVar24 = _DAT_0027c490;
    } while (pauVar5 < pauVar1);
  }
  for (; auVar15 = _DAT_0027c490, pauVar6 < pauVar1;
      pauVar6 = (undefined1 (*) [16])((long)*pauVar6 + 4)) {
    fVar35 = *(float *)*pauVar6;
    fVar9 = fVar35 + 2.0;
    fVar4 = (float)((uint)fVar9 & 0x7fffff | 0x3f000000);
    fVar13 = fVar13 + fVar35;
    auVar20._4_12_ = DAT_0027c490._4_12_;
    auVar20._0_4_ = fVar35 * 6.0 + 13.0;
    auVar22._0_4_ = fVar9 * 12.0 * fVar9;
    auVar22._4_4_ = fVar4 + 0.35208872;
    auVar22._8_8_ = 0;
    auVar21 = divps(auVar20,auVar22);
    _DAT_0027c490 = auVar24;
    *(float *)*pauVar6 =
         ((fVar4 * -1.4980303 + (float)(uint)fVar9 * 1.1920929e-07 + -124.22545) - auVar21._4_4_) *
         0.6931472 + (-(fVar35 + fVar35 + 1.0) / ((fVar35 + 1.0) * fVar35) - auVar21._0_4_);
    auVar24 = _DAT_0027c490;
    _DAT_0027c490 = auVar15;
  }
  fVar13 = fVar19 + fVar18 + fVar17 + fVar16 + fVar13;
  fVar17 = fVar13 + 2.0;
  fVar16 = (float)((uint)fVar17 & 0x7fffff | 0x3f000000);
  auVar10._0_4_ = fVar17 * 12.0 * fVar17;
  auVar10._4_4_ = fVar16 + 0.35208872;
  auVar10._8_8_ = 0;
  auVar14._4_12_ = auVar24._4_12_;
  auVar14._0_4_ = fVar13 * 6.0 + 13.0;
  auVar15 = divps(auVar14,auVar10);
  fVar13 = ((fVar16 * -1.4980303 + (float)(uint)fVar17 * 1.1920929e-07 + -124.22545) - auVar15._4_4_
           ) * 0.6931472 + (-(fVar13 + fVar13 + 1.0) / ((fVar13 + 1.0) * fVar13) - auVar15._0_4_);
  pauVar3 = (undefined1 (*) [16])gamma;
  _DAT_0027c490 = auVar24;
  if (bVar8 && uVar2 != 0) {
    do {
      fVar17 = (*(float *)*pauVar3 - fVar13) * 1.442695;
      fVar16 = -126.0;
      if (-126.0 <= fVar17) {
        fVar16 = fVar17;
      }
      fVar17 = (fVar16 - (float)(int)fVar16) + (float)(-(uint)(fVar17 < 0.0) & 0x3f800000);
      fVar17 = (float)(long)((fVar17 * -1.4901291 +
                             27.728024 / (4.8425255 - fVar17) + fVar16 + 121.274086) * 8388608.0);
      fVar16 = fVar17;
      if (fVar17 <= underflow_threshold) {
        fVar16 = underflow_threshold;
      }
      *(uint *)*pauVar3 =
           ~-(uint)NAN(underflow_threshold) & (uint)fVar16 |
           -(uint)NAN(underflow_threshold) & (uint)fVar17;
      pauVar3 = (undefined1 (*) [16])((long)*pauVar3 + 4);
      gamma = gamma + 1;
    } while ((pauVar3 < pauVar1) && (((ulong)gamma & 0xf) != 0));
  }
  auVar24 = _DAT_0027c5d0;
  if (pauVar3 + 1 < pauVar1 && ((ulong)gamma & 0xf) == 0) {
    auVar34._4_4_ = underflow_threshold;
    auVar34._0_4_ = underflow_threshold;
    pauVar6 = pauVar3;
    do {
      fVar16 = (*(float *)*pauVar6 - fVar13) * 1.442695;
      fVar17 = (*(float *)((long)*pauVar6 + 4) - fVar13) * 1.442695;
      fVar18 = (*(float *)((long)*pauVar6 + 8) - fVar13) * 1.442695;
      fVar19 = (*(float *)((long)*pauVar6 + 0xc) - fVar13) * 1.442695;
      fVar35 = (float)(~-(uint)(fVar16 < -126.0) & (uint)(fVar16 + 0.0) |
                      -(uint)(fVar16 < -126.0) & 0xc2fc0000);
      fVar4 = (float)(~-(uint)(fVar17 < -126.0) & (uint)(fVar17 + 0.0) |
                     -(uint)(fVar17 < -126.0) & 0xc2fc0000);
      fVar9 = (float)(~-(uint)(fVar18 < -126.0) & (uint)(fVar18 + 0.0) |
                     -(uint)(fVar18 < -126.0) & 0xc2fc0000);
      fVar36 = (float)(~-(uint)(fVar19 < -126.0) & (uint)(fVar19 + 0.0) |
                      -(uint)(fVar19 < -126.0) & 0xc2fc0000);
      fVar16 = (fVar35 - (float)(int)fVar35) + (float)(-(uint)(fVar16 < 0.0) & 0x3f800000);
      fVar17 = (fVar4 - (float)(int)fVar4) + (float)(-(uint)(fVar17 < 0.0) & 0x3f800000);
      fVar18 = (fVar9 - (float)(int)fVar9) + (float)(-(uint)(fVar18 < 0.0) & 0x3f800000);
      fVar19 = (fVar36 - (float)(int)fVar36) + (float)(-(uint)(fVar19 < 0.0) & 0x3f800000);
      auVar11._0_4_ = 4.8425255 - fVar16;
      auVar11._4_4_ = 4.8425255 - fVar17;
      auVar11._8_4_ = 4.8425255 - fVar18;
      auVar11._12_4_ = 4.8425255 - fVar19;
      auVar15 = divps(auVar24,auVar11);
      auVar12._0_4_ = (int)((fVar16 * -1.4901291 + auVar15._0_4_ + fVar35 + 121.274086) * 8388608.0)
      ;
      auVar12._4_4_ = (int)((fVar17 * -1.4901291 + auVar15._4_4_ + fVar4 + 121.274086) * 8388608.0);
      auVar12._8_4_ = (int)((fVar18 * -1.4901291 + auVar15._8_4_ + fVar9 + 121.274086) * 8388608.0);
      auVar12._12_4_ =
           (int)((fVar19 * -1.4901291 + auVar15._12_4_ + fVar36 + 121.274086) * 8388608.0);
      auVar34._8_4_ = underflow_threshold;
      auVar34._12_4_ = underflow_threshold;
      auVar15 = maxps(auVar34,auVar12);
      *pauVar6 = auVar15;
      pauVar3 = pauVar6 + 1;
      pauVar5 = pauVar6 + 2;
      pauVar6 = pauVar3;
    } while (pauVar5 < pauVar1);
  }
  if (pauVar3 < pauVar1) {
    do {
      fVar17 = (*(float *)*pauVar3 - fVar13) * 1.442695;
      fVar16 = -126.0;
      if (-126.0 <= fVar17) {
        fVar16 = fVar17;
      }
      fVar17 = (fVar16 - (float)(int)fVar16) + (float)(-(uint)(fVar17 < 0.0) & 0x3f800000);
      fVar17 = (float)(long)((fVar17 * -1.4901291 +
                             27.728024 / (4.8425255 - fVar17) + fVar16 + 121.274086) * 8388608.0);
      fVar16 = fVar17;
      if (fVar17 <= underflow_threshold) {
        fVar16 = underflow_threshold;
      }
      *(uint *)*pauVar3 =
           ~-(uint)NAN(underflow_threshold) & (uint)fVar16 |
           -(uint)NAN(underflow_threshold) & (uint)fVar17;
      pauVar3 = (undefined1 (*) [16])((long)*pauVar3 + 4);
    } while (pauVar3 < pauVar1);
  }
  return;
}

Assistant:

void vexpdigammify(vw &all, float *gamma, const float underflow_threshold)
{
  float extra_sum = 0.0f;
  v4sf sum = v4sfl(0.0f);
  float *fp;
  const float *fpend = gamma + all.lda;

  // Iterate through the initial part of the array that isn't 128-bit SIMD
  // aligned.
  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

  // Rip through the aligned portion...
  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    sum = sum + arg;
    arg = vfastdigamma(arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

#if defined(__SSE3__) || defined(__SSE4_1__)
  // Do two horizontal adds on sum, extract the total from the 0 element:
  sum = _mm_hadd_ps(sum, sum);
  sum = _mm_hadd_ps(sum, sum);
  extra_sum += v4sf_index<0>(sum);
#else
  extra_sum += v4sf_index<0>(sum) + v4sf_index<1>(sum) + v4sf_index<2>(sum) + v4sf_index<3>(sum);
#endif

  extra_sum = fastdigamma(extra_sum);
  sum = v4sfl(extra_sum);

  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = arg - sum;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }
}